

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

string * __thiscall
cmake::ReportCapabilities_abi_cxx11_(string *__return_storage_ptr__,cmake *this,bool haveServerMode)

{
  size_t in_RCX;
  FastWriter writer;
  Value local_90;
  FastWriter local_68;
  string local_38 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Json::FastWriter::FastWriter(&local_68);
  ReportCapabilitiesJson(&local_90,this,haveServerMode);
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_38,(int)&local_68,&local_90,in_RCX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_38);
  std::__cxx11::string::~string(local_38);
  Json::Value::~Value(&local_90);
  Json::FastWriter::~FastWriter(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::ReportCapabilities(bool haveServerMode) const
{
  std::string result;
#if defined(CMAKE_BUILD_WITH_CMAKE)
  Json::FastWriter writer;
  result = writer.write(this->ReportCapabilitiesJson(haveServerMode));
#else
  result = "Not supported";
#endif
  return result;
}